

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddTestCommand.cxx
# Opt level: O3

bool cmAddTestCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  int iVar3;
  cmTest *pcVar4;
  undefined8 uVar5;
  cmTestGenerator *pcVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  bool bVar7;
  pointer *__ptr;
  ulong uVar8;
  string *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  uint uVar11;
  ulong uVar12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string working_directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command_1;
  size_type __dnew;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  undefined1 local_138 [16];
  undefined1 local_128 [32];
  string local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  undefined1 local_98 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 != __last._M_current) {
    iVar3 = std::__cxx11::string::compare((char *)pbVar10);
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3 == 0) {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      uVar11 = 0;
      local_108._M_string_length = 0;
      local_108.field_2._M_local_buf[0] = '\0';
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((ulong)((long)__last._M_current - (long)pbVar10) < 0x21) {
LAB_00330cfe:
        local_138._0_8_ = local_128;
        local_98._0_8_ = &DAT_0000001e;
        local_138._0_8_ = std::__cxx11::string::_M_create((ulong *)local_138,(ulong)local_98);
        local_128._0_8_ = local_98._0_8_;
        builtin_strncpy((char *)((long)&((pointer)local_138._0_8_)->_M_string_length + 6)," non-emp"
                        ,8);
        builtin_strncpy((char *)((long)&((pointer)local_138._0_8_)->field_2 + 6),"ty NAME.",8);
        (((pointer)local_138._0_8_)->_M_dataplus)._M_p = (pointer)0x6562207473756d20;
        ((pointer)local_138._0_8_)->_M_string_length = 0x6e206e6576696720;
        local_138._8_8_ = local_98._0_8_;
        *(char *)(local_98._0_8_ + (long)&((pointer)local_138._0_8_)->_M_dataplus) = '\0';
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00330d5e:
        local_50.field_2._M_allocated_capacity = local_128._0_8_;
        local_50._M_dataplus._M_p = (pointer)local_138._0_8_;
        if ((pointer)local_138._0_8_ != (pointer)local_128) {
LAB_00330d6c:
          operator_delete(local_50._M_dataplus._M_p,
                          (ulong)((long)&(((pointer)local_50.field_2._M_allocated_capacity)->
                                         _M_dataplus)._M_p + 1));
        }
      }
      else {
        local_e8._8_8_ = 0;
        uVar8 = 1;
        uVar12 = 2;
        do {
          iVar3 = std::__cxx11::string::compare((char *)(pbVar10 + uVar8));
          if (iVar3 == 0) {
            uVar11 = 1;
            if (local_b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_138._0_8_ = local_128;
              local_98._0_8_ = (pointer)0x22;
              local_138._0_8_ = std::__cxx11::string::_M_create((ulong *)local_138,(ulong)local_98);
              local_128._0_8_ = local_98._0_8_;
              (((pointer)local_138._0_8_)->field_2)._M_allocated_capacity = 0x6e6f2074736f6d20;
              builtin_strncpy((char *)((long)&((pointer)local_138._0_8_)->field_2 + 8),"e COMMAN",8)
              ;
              (((pointer)local_138._0_8_)->_M_dataplus)._M_p = (pointer)0x2065622079616d20;
              ((pointer)local_138._0_8_)->_M_string_length = 0x7461206e65766967;
              *(undefined2 *)&(((pointer)(local_138._0_8_ + 0x20))->_M_dataplus)._M_p = 0x2e44;
              local_138._8_8_ = local_98._0_8_;
              *(char *)(local_98._0_8_ + (long)&((pointer)local_138._0_8_)->_M_dataplus) = '\0';
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_00330d5e;
            }
          }
          else {
            iVar3 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar8));
            if (iVar3 == 0) {
              uVar11 = 2;
              if (local_68.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_68.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                local_138._0_8_ = local_128;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_138," may be given at most one set of CONFIGURATIONS.",""
                          );
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_00330d5e;
              }
            }
            else {
              iVar3 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar8));
              if (iVar3 == 0) {
                uVar11 = 3;
                if (local_d8._M_string_length != 0) {
                  local_138._0_8_ = local_128;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_138," may be given at most one WORKING_DIRECTORY.","");
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                  goto LAB_00330d5e;
                }
              }
              else {
                uVar5 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar8));
                if ((int)uVar5 == 0) {
                  if ((local_e8._8_8_ & 1) != 0) {
                    local_138._0_8_ = local_128;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_138," may be given at most one COMMAND_EXPAND_LISTS."
                               ,"");
                    std::__cxx11::string::_M_assign((string *)&status->Error);
                    goto LAB_00330d5e;
                  }
                  uVar11 = 4;
                  local_e8._8_8_ = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                }
                else {
                  if (3 < uVar11) {
                    local_138._0_8_ = (pointer)0x1b;
                    local_138._8_8_ = " given unknown argument:\n  ";
                    pbVar2 = (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    local_98._8_8_ = pbVar2[uVar8]._M_dataplus._M_p;
                    local_98._0_8_ = pbVar2[uVar8]._M_string_length;
                    cmStrCat<char[2]>(&local_50,(cmAlphaNum *)local_138,(cmAlphaNum *)local_98,
                                      (char (*) [2])0x788a15);
                    std::__cxx11::string::_M_assign((string *)&status->Error);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00330d74;
                    goto LAB_00330d6c;
                  }
                  psVar9 = &local_108;
                  switch(uVar11) {
                  case 1:
                    uVar11 = 1;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&local_b8,
                                (args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar8);
                    break;
                  case 2:
                    uVar11 = 2;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&local_68,
                                (args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar8);
                    break;
                  case 3:
                    psVar9 = &local_d8;
                  case 0:
                    uVar11 = 4;
                    std::__cxx11::string::_M_assign((string *)psVar9);
                  }
                }
              }
            }
          }
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          bVar7 = uVar12 < (ulong)((long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10
                                  >> 5);
          uVar8 = uVar12;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (bVar7);
        if ((pointer)local_108._M_string_length == (pointer)0x0) goto LAB_00330cfe;
        if (local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_138._0_8_ = local_128;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_138," must be given non-empty COMMAND.","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00330d5e;
        }
        pcVar1 = status->Makefile;
        pcVar4 = cmMakefile::GetTest(pcVar1,&local_108);
        if (pcVar4 == (cmTest *)0x0) {
          pcVar4 = cmMakefile::CreateTest(pcVar1,&local_108);
          pcVar4->OldStyle = false;
          cmTest::SetCommand(pcVar4,&local_b8);
          if (local_d8._M_string_length != 0) {
            local_138._0_8_ = (pointer)local_128;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_138,"WORKING_DIRECTORY","");
            cmTest::SetProperty(pcVar4,(string *)local_138,&local_d8);
            if ((pointer)local_138._0_8_ != (pointer)local_128) {
              operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
            }
          }
          cmTest::SetCommandExpandLists(pcVar4,(bool)(local_e8._M_local_buf[8] & 1));
          pcVar6 = (cmTestGenerator *)operator_new(0x88);
          cmTestGenerator::cmTestGenerator(pcVar6,pcVar4,&local_68);
          local_138._0_8_ = pcVar6;
          cmMakefile::AddTestGenerator
                    (pcVar1,(unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_> *)
                            local_138);
          if ((cmTestGenerator *)local_138._0_8_ != (cmTestGenerator *)0x0) {
            (**(code **)(*(long *)local_138._0_8_ + 8))();
          }
          local_138._0_8_ = (pointer)0x0;
          bVar7 = true;
          goto LAB_00330d76;
        }
        local_138._0_8_ = (pointer)0x12;
        local_138._8_8_ = " given test NAME \"";
        local_128._0_8_ = local_108._M_string_length;
        local_128._8_8_ = local_108._M_dataplus._M_p;
        local_128._16_8_ = 0x29;
        local_128._24_8_ = "\" which already exists in this directory.";
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_138;
        cmCatViews_abi_cxx11_((string *)local_98,views_00);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        local_50.field_2._M_allocated_capacity = (size_type)local_88._M_dataplus;
        local_50._M_dataplus._M_p = (pointer)local_98._0_8_;
        if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) goto LAB_00330d6c;
      }
LAB_00330d74:
      bVar7 = false;
LAB_00330d76:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                 local_d8.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p == &local_108.field_2) {
        return bVar7;
      }
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
      return bVar7;
    }
  }
  if ((ulong)((long)__last._M_current - (long)pbVar10) < 0x21) {
    local_138._0_8_ = (pointer)local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((pointer)local_138._0_8_ != (pointer)local_128) {
      operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
    }
    return false;
  }
  pcVar1 = status->Makefile;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
             pbVar10 + 1,__last,(allocator_type *)local_138);
  pcVar4 = cmMakefile::GetTest(pcVar1,(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start);
  if (pcVar4 == (cmTest *)0x0) {
    pcVar4 = cmMakefile::CreateTest
                       (pcVar1,(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    pcVar4->OldStyle = true;
    pcVar6 = (cmTestGenerator *)operator_new(0x88);
    local_138._0_8_ = (pointer)0x0;
    local_138._8_8_ = (pointer)0x0;
    local_128._0_8_ = (pointer)0x0;
    cmTestGenerator::cmTestGenerator
              (pcVar6,pcVar4,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_138);
    local_e8._M_allocated_capacity = (size_type)pcVar6;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_138);
    cmMakefile::AddTestGenerator
              (pcVar1,(unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_> *)
                      &local_e8._M_allocated_capacity);
    if ((cmTestGenerator *)local_e8._M_allocated_capacity != (cmTestGenerator *)0x0) {
      (**(code **)(*(long *)local_e8._M_allocated_capacity + 8))();
    }
    local_e8._M_allocated_capacity = 0;
  }
  else if (pcVar4->OldStyle == false) {
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_128._8_8_ = (pbVar2->_M_dataplus)._M_p;
    local_128._0_8_ = pbVar2->_M_string_length;
    local_138._0_8_ = (pointer)0x12;
    local_138._8_8_ = " given test name \"";
    local_128._16_8_ = 0x29;
    local_128._24_8_ = "\" which already exists in this directory.";
    views._M_len = 3;
    views._M_array = (iterator)local_138;
    cmCatViews_abi_cxx11_((string *)local_98,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,(ulong)((long)local_88._M_dataplus._M_p + 1));
    }
    bVar7 = false;
    goto LAB_00330cef;
  }
  bVar7 = true;
  cmTest::SetCommand(pcVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_108);
LAB_00330cef:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_108);
  return bVar7;
}

Assistant:

bool cmAddTestCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (!args.empty() && args[0] == "NAME") {
    return cmAddTestCommandHandleNameMode(args, status);
  }

  // First argument is the name of the test Second argument is the name of
  // the executable to run (a target or external program) Remaining arguments
  // are the arguments to pass to the executable
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  // Collect the command with arguments.
  std::vector<std::string> command(args.begin() + 1, args.end());

  // Create the test but add a generator only the first time it is
  // seen.  This preserves behavior from before test generators.
  cmTest* test = mf.GetTest(args[0]);
  if (test) {
    // If the test was already added by a new-style signature do not
    // allow it to be duplicated.
    if (!test->GetOldStyle()) {
      status.SetError(cmStrCat(" given test name \"", args[0],
                               "\" which already exists in this directory."));
      return false;
    }
  } else {
    test = mf.CreateTest(args[0]);
    test->SetOldStyle(true);
    mf.AddTestGenerator(cm::make_unique<cmTestGenerator>(test));
  }
  test->SetCommand(command);

  return true;
}